

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

nullres nullcRedirectFunction(uint sourceId,uint targetId)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 uVar4;
  nullres nVar5;
  long lVar6;
  long lVar7;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    nVar5 = '\0';
  }
  else {
    if (NULLC::currExec == 1) {
      ExecutorX86::UpdateFunctionPointer(NULLC::executorX86,sourceId,targetId);
    }
    if ((*(uint *)(NULLC::linker + 0x24c) <= sourceId) ||
       (*(uint *)(NULLC::linker + 0x24c) <= targetId)) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x7f,
                    "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
                   );
    }
    lVar3 = *(long *)(NULLC::linker + 0x240);
    lVar6 = (ulong)sourceId * 0x94;
    lVar7 = (ulong)targetId * 0x94;
    *(undefined8 *)(lVar3 + 4 + lVar6) = *(undefined8 *)(lVar3 + 4 + lVar7);
    *(undefined4 *)(lVar3 + 0xc + lVar6) = *(undefined4 *)(lVar3 + 0xc + lVar7);
    puVar1 = (undefined8 *)(lVar3 + 0x1c + lVar7);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)(lVar3 + 0x1c + lVar6);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    *(undefined8 *)(lVar3 + 0x2c + lVar6) = *(undefined8 *)(lVar3 + 0x2c + lVar7);
    nVar5 = '\x01';
  }
  return nVar5;
}

Assistant:

nullres nullcRedirectFunction(unsigned sourceId, unsigned targetId)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		executorX86->UpdateFunctionPointer(sourceId, targetId);
#endif

	ExternFuncInfo &destFunc = linker->exFunctions[sourceId];
	ExternFuncInfo &srcFunc = linker->exFunctions[targetId];

	destFunc.regVmAddress = srcFunc.regVmAddress;
	destFunc.regVmCodeSize = srcFunc.regVmCodeSize;
	destFunc.regVmRegisters = srcFunc.regVmRegisters;

	destFunc.funcPtrRaw = srcFunc.funcPtrRaw;
	destFunc.funcPtrWrapTarget = srcFunc.funcPtrWrapTarget;
	destFunc.funcPtrWrap = srcFunc.funcPtrWrap;

	return true;
}